

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder_unittest.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::PathBuilderKeyRolloverTest_TestMultipleRootMatchesOnlyOneWorks_Test::TestBody
          (PathBuilderKeyRolloverTest_TestMultipleRootMatchesOnlyOneWorks_Test *this)

{
  CertPathBuilderResultPath *pCVar1;
  bool bVar2;
  string *psVar3;
  pointer *__ptr;
  char *pcVar4;
  pointer *__ptr_6;
  AssertHelper local_2b8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a8;
  AssertHelper local_2a0;
  VerifyError error;
  shared_ptr<const_bssl::ParsedCertificate> local_268;
  shared_ptr<const_bssl::ParsedCertificate> local_258;
  shared_ptr<const_bssl::ParsedCertificate> local_248;
  shared_ptr<const_bssl::ParsedCertificate> local_238;
  Result result;
  TrustStoreCollection trust_store_collection;
  CertIssuerSourceStatic sync_certs;
  TrustStoreInMemory trust_store2;
  TrustStoreInMemory trust_store1;
  CertPathBuilder path_builder;
  
  TrustStoreCollection::TrustStoreCollection(&trust_store_collection);
  TrustStoreInMemory::TrustStoreInMemory(&trust_store1);
  TrustStoreInMemory::TrustStoreInMemory(&trust_store2);
  TrustStoreCollection::AddTrustStore(&trust_store_collection,&trust_store1.super_TrustStore);
  TrustStoreCollection::AddTrustStore(&trust_store_collection,&trust_store2.super_TrustStore);
  local_238.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_PathBuilderKeyRolloverTest).newroot_.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_238.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->super_PathBuilderKeyRolloverTest).newroot_.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_238.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_238.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_238.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_238.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_238.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  TrustStoreInMemory::AddTrustAnchor(&trust_store1,&local_238);
  if (local_238.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_238.
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_248.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_PathBuilderKeyRolloverTest).oldroot_.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_248.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->super_PathBuilderKeyRolloverTest).oldroot_.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_248.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_248.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_248.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_248.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_248.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  TrustStoreInMemory::AddTrustAnchor(&trust_store2,&local_248);
  if (local_248.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  CertIssuerSourceStatic::CertIssuerSourceStatic(&sync_certs);
  local_258.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_PathBuilderKeyRolloverTest).oldintermediate_.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_258.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->super_PathBuilderKeyRolloverTest).oldintermediate_.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_258.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_258.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_258.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_258.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_258.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  CertIssuerSourceStatic::AddCert(&sync_certs,&local_258);
  if (local_258.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_268.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_PathBuilderKeyRolloverTest).target_.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_268.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->super_PathBuilderKeyRolloverTest).target_.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_268.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_268.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_268.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_268.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_268.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  pcVar4 = (char *)0x0;
  CertPathBuilder::CertPathBuilder
            (&path_builder,&local_268,&trust_store_collection.super_TrustStore,
             &(this->super_PathBuilderKeyRolloverTest).delegate_.super_CertPathBuilderDelegate,
             &(this->super_PathBuilderKeyRolloverTest).time_,ANY_EKU,
             (this->super_PathBuilderKeyRolloverTest).initial_explicit_policy_,
             &(this->super_PathBuilderKeyRolloverTest).user_initial_policy_set_,
             (this->super_PathBuilderKeyRolloverTest).initial_policy_mapping_inhibit_,
             (this->super_PathBuilderKeyRolloverTest).initial_any_policy_inhibit_);
  if (local_268.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_268.
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  CertPathBuilder::AddCertIssuerSource(&path_builder,&sync_certs.super_CertIssuerSource);
  CertPathBuilder::Run(&result,&path_builder);
  bVar2 = CertPathBuilder::Result::HasValidPath(&result);
  local_2b0._M_head_impl._0_1_ = (internal)bVar2;
  local_2a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_2b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&error,(internal *)&local_2b0,(AssertionResult *)"result.HasValidPath()",
               "false","true",pcVar4);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
               ,0x524,(char *)CONCAT71(error.offset_._1_7_,(char)error.offset_));
    testing::internal::AssertHelper::operator=(&local_2a0,(Message *)&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    if ((string *)CONCAT71(error.offset_._1_7_,(char)error.offset_) != &error.diagnostic_) {
      operator_delete((undefined1 *)CONCAT71(error.offset_._1_7_,(char)error.offset_),
                      (ulong)(error.diagnostic_._M_dataplus._M_p + 1));
    }
    if ((long *)CONCAT44(local_2b8.data_._4_4_,(StatusCode)local_2b8.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_2b8.data_._4_4_,(StatusCode)local_2b8.data_) + 8))();
    }
    if (local_2a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2a8,local_2a8);
    }
  }
  local_2b8.data_._0_4_ = CERTIFICATE_INVALID_SIGNATURE;
  local_2b0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)result.paths.
              super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)result.paths.
              super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&error,"1U","result.paths.size()",(uint *)&local_2b8,
             (unsigned_long *)&local_2b0);
  if ((char)error.offset_ == '\0') {
    testing::Message::Message((Message *)&local_2b0);
    if (error._8_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)error._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
               ,0x525,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2b8,(Message *)&local_2b0);
  }
  else {
    if (error._8_8_ != 0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&error.code_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)error._8_8_)
      ;
    }
    bVar2 = CertPathBuilderResultPath::IsValid
                      (result.paths.
                       super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[result.best_result_index]._M_t.
                       super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                       .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl
                      );
    local_2b0._M_head_impl._0_1_ = (internal)bVar2;
    local_2a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)&local_2b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&error,(internal *)&local_2b0,
                 (AssertionResult *)"result.paths[result.best_result_index]->IsValid()","false",
                 "true",pcVar4);
      testing::internal::AssertHelper::AssertHelper
                (&local_2a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                 ,0x52a,(char *)CONCAT71(error.offset_._1_7_,(char)error.offset_));
      testing::internal::AssertHelper::operator=(&local_2a0,(Message *)&local_2b8);
      testing::internal::AssertHelper::~AssertHelper(&local_2a0);
      if ((string *)CONCAT71(error.offset_._1_7_,(char)error.offset_) != &error.diagnostic_) {
        operator_delete((undefined1 *)CONCAT71(error.offset_._1_7_,(char)error.offset_),
                        (ulong)(error.diagnostic_._M_dataplus._M_p + 1));
      }
      if ((long *)CONCAT44(local_2b8.data_._4_4_,(StatusCode)local_2b8.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_2b8.data_._4_4_,(StatusCode)local_2b8.data_) + 8))();
      }
      if (local_2a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2a8,local_2a8);
      }
    }
    pCVar1 = result.paths.
             super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[result.best_result_index]._M_t.
             super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
             ._M_t.
             super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
             .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl;
    local_2b8.data_._0_4_ = CERTIFICATE_UNSUPPORTED_SIGNATURE_ALGORITHM;
    local_2b0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)*(pointer *)
                 ((long)&(pCVar1->certs).
                         super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                 + 8) -
          *(long *)&(pCVar1->certs).
                    super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
         >> 4);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&error,"3U","path.certs.size()",(uint *)&local_2b8,
               (unsigned_long *)&local_2b0);
    if ((char)error.offset_ != '\0') {
      if (error._8_8_ != 0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&error.code_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     error._8_8_);
      }
      testing::internal::
      CmpHelperEQ<std::shared_ptr<bssl::ParsedCertificate_const>,std::shared_ptr<bssl::ParsedCertificate_const>>
                ((internal *)&error,"target_","path.certs[0]",
                 &(this->super_PathBuilderKeyRolloverTest).target_,
                 *(shared_ptr<const_bssl::ParsedCertificate> **)
                  &(pCVar1->certs).
                   super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                );
      if ((char)error.offset_ == '\0') {
        testing::Message::Message((Message *)&local_2b0);
        if (error._8_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)error._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x52d,pcVar4);
        testing::internal::AssertHelper::operator=(&local_2b8,(Message *)&local_2b0);
        testing::internal::AssertHelper::~AssertHelper(&local_2b8);
        if (local_2b0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_2b0._M_head_impl + 8))();
        }
      }
      if (error._8_8_ != 0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&error.code_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     error._8_8_);
      }
      testing::internal::
      CmpHelperEQ<std::shared_ptr<bssl::ParsedCertificate_const>,std::shared_ptr<bssl::ParsedCertificate_const>>
                ((internal *)&error,"oldintermediate_","path.certs[1]",
                 &(this->super_PathBuilderKeyRolloverTest).oldintermediate_,
                 (shared_ptr<const_bssl::ParsedCertificate> *)
                 (*(long *)&(pCVar1->certs).
                            super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                 + 0x10));
      if ((char)error.offset_ == '\0') {
        testing::Message::Message((Message *)&local_2b0);
        if (error._8_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)error._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x52e,pcVar4);
        testing::internal::AssertHelper::operator=(&local_2b8,(Message *)&local_2b0);
        testing::internal::AssertHelper::~AssertHelper(&local_2b8);
        if (local_2b0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_2b0._M_head_impl + 8))();
        }
      }
      if (error._8_8_ != 0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&error.code_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     error._8_8_);
      }
      testing::internal::
      CmpHelperEQ<std::shared_ptr<bssl::ParsedCertificate_const>,std::shared_ptr<bssl::ParsedCertificate_const>>
                ((internal *)&error,"oldroot_","path.certs[2]",
                 &(this->super_PathBuilderKeyRolloverTest).oldroot_,
                 (shared_ptr<const_bssl::ParsedCertificate> *)
                 (*(long *)&(pCVar1->certs).
                            super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                 + 0x20));
      if ((char)error.offset_ == '\0') {
        testing::Message::Message((Message *)&local_2b0);
        if (error._8_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)error._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x52f,pcVar4);
        testing::internal::AssertHelper::operator=(&local_2b8,(Message *)&local_2b0);
        testing::internal::AssertHelper::~AssertHelper(&local_2b8);
        if (local_2b0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_2b0._M_head_impl + 8))();
        }
      }
      if (error._8_8_ != 0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&error.code_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     error._8_8_);
      }
      CertPathBuilder::Result::GetBestPathVerifyError(&error,&result);
      local_2b8.data_._0_4_ = VerifyError::Code(&error);
      local_2a0.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<bssl::VerifyError::StatusCode,bssl::VerifyError::StatusCode>
                ((internal *)&local_2b0,"error.Code()","VerifyError::StatusCode::PATH_VERIFIED",
                 (StatusCode *)&local_2b8,(StatusCode *)&local_2a0);
      if (local_2b0._M_head_impl._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_2b8);
        psVar3 = VerifyError::DiagnosticString_abi_cxx11_(&error);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_2b8.data_._4_4_,(StatusCode)local_2b8.data_) + 0x10),
                   (psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
        if (local_2a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (local_2a8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x532,pcVar4);
        testing::internal::AssertHelper::operator=(&local_2a0,(Message *)&local_2b8);
        testing::internal::AssertHelper::~AssertHelper(&local_2a0);
        if ((long *)CONCAT44(local_2b8.data_._4_4_,(StatusCode)local_2b8.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_2b8.data_._4_4_,(StatusCode)local_2b8.data_) + 8))();
        }
      }
      if (local_2a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2a8,local_2a8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error.diagnostic_._M_dataplus._M_p != &error.diagnostic_.field_2) {
        operator_delete(error.diagnostic_._M_dataplus._M_p,
                        error.diagnostic_.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00364338;
    }
    testing::Message::Message((Message *)&local_2b0);
    if (error._8_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)error._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
               ,0x52c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2b8,(Message *)&local_2b0);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_2b8);
  if (local_2b0._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_2b0._M_head_impl + 8))();
  }
  if (error._8_8_ != 0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&error.code_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)error._8_8_);
  }
LAB_00364338:
  CertPathBuilder::Result::~Result(&result);
  CertPathBuilder::~CertPathBuilder(&path_builder);
  CertIssuerSourceStatic::~CertIssuerSourceStatic(&sync_certs);
  TrustStoreInMemory::~TrustStoreInMemory(&trust_store2);
  TrustStoreInMemory::~TrustStoreInMemory(&trust_store1);
  TrustStoreCollection::~TrustStoreCollection(&trust_store_collection);
  return;
}

Assistant:

TEST_F(PathBuilderKeyRolloverTest, TestMultipleRootMatchesOnlyOneWorks) {
  TrustStoreCollection trust_store_collection;
  TrustStoreInMemory trust_store1;
  TrustStoreInMemory trust_store2;
  trust_store_collection.AddTrustStore(&trust_store1);
  trust_store_collection.AddTrustStore(&trust_store2);
  // Add two trust anchors (newroot_ and oldroot_). Path building will attempt
  // them in this same order, as trust_store1 was added to
  // trust_store_collection first.
  trust_store1.AddTrustAnchor(newroot_);
  trust_store2.AddTrustAnchor(oldroot_);

  // Only oldintermediate is supplied, so the path with newroot should fail,
  // oldroot should succeed.
  CertIssuerSourceStatic sync_certs;
  sync_certs.AddCert(oldintermediate_);

  CertPathBuilder path_builder(
      target_, &trust_store_collection, &delegate_, time_, KeyPurpose::ANY_EKU,
      initial_explicit_policy_, user_initial_policy_set_,
      initial_policy_mapping_inhibit_, initial_any_policy_inhibit_);
  path_builder.AddCertIssuerSource(&sync_certs);

  auto result = path_builder.Run();

  EXPECT_TRUE(result.HasValidPath());
  ASSERT_EQ(1U, result.paths.size());

  // Due to authorityKeyIdentifier prioritization, path builder will first
  // attempt: target <- old intermediate <- oldroot
  // which should succeed.
  EXPECT_TRUE(result.paths[result.best_result_index]->IsValid());
  const auto &path = *result.paths[result.best_result_index];
  ASSERT_EQ(3U, path.certs.size());
  EXPECT_EQ(target_, path.certs[0]);
  EXPECT_EQ(oldintermediate_, path.certs[1]);
  EXPECT_EQ(oldroot_, path.certs[2]);

  VerifyError error = result.GetBestPathVerifyError();
  ASSERT_EQ(error.Code(), VerifyError::StatusCode::PATH_VERIFIED)
      << error.DiagnosticString();
}